

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void __thiscall
xemmai::t_heap<xemmai::t_object>::t_of<4UL,_256UL>::f_return(t_of<4UL,_256UL> *this,size_t a_n)

{
  __pointer_type __p2;
  bool bVar1;
  __pointer_type ptVar2;
  long *in_FS_OFFSET;
  t_object *p;
  size_t a_n_local;
  t_of<4UL,_256UL> *this_local;
  
  __p2 = *(__pointer_type *)(*in_FS_OFFSET + -0x38);
  __p2->v_cyclic = a_n;
  ptVar2 = std::atomic<xemmai::t_object_*>::load(&this->v_chunks,relaxed);
  __p2->v_previous = ptVar2;
  do {
    bVar1 = std::atomic<xemmai::t_object_*>::compare_exchange_weak
                      (&this->v_chunks,&__p2->v_previous,__p2,release);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  in_FS_OFFSET[-7] = 0;
  LOCK();
  (this->v_returned).super___atomic_base<unsigned_long>._M_i =
       (this->v_returned).super___atomic_base<unsigned_long>._M_i + a_n;
  UNLOCK();
  return;
}

Assistant:

void f_return(size_t a_n)
		{
			auto p = v_head<A_rank>;
			p->v_cyclic = a_n;
			p->v_previous = v_chunks.load(std::memory_order_relaxed);
			while (!v_chunks.compare_exchange_weak(p->v_previous, p, std::memory_order_release));
			v_head<A_rank> = nullptr;
			v_returned.fetch_add(a_n, std::memory_order_relaxed);
		}